

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

FLOW_HANDLE flow_clone(FLOW_HANDLE value)

{
  AMQP_VALUE pAVar1;
  FLOW_HANDLE local_18;
  FLOW_INSTANCE *flow_instance;
  FLOW_HANDLE value_local;
  
  local_18 = (FLOW_HANDLE)malloc(8);
  if (local_18 != (FLOW_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (FLOW_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

FLOW_HANDLE flow_clone(FLOW_HANDLE value)
{
    FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)malloc(sizeof(FLOW_INSTANCE));
    if (flow_instance != NULL)
    {
        flow_instance->composite_value = amqpvalue_clone(((FLOW_INSTANCE*)value)->composite_value);
        if (flow_instance->composite_value == NULL)
        {
            free(flow_instance);
            flow_instance = NULL;
        }
    }

    return flow_instance;
}